

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

void __thiscall SQNativeClosure::~SQNativeClosure(SQNativeClosure *this)

{
  SQUnsignedInteger *pSVar1;
  SQWeakRef *pSVar2;
  
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQNativeClosure_0013db78;
  pSVar2 = this->_env;
  if (pSVar2 != (SQWeakRef *)0x0) {
    pSVar1 = &(pSVar2->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar2->super_SQRefCounted)._vptr_SQRefCounted[2])();
    }
    this->_env = (SQWeakRef *)0x0;
  }
  if (((this->super_SQCollectable).super_SQRefCounted._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
  }
  SQObjectPtr::~SQObjectPtr(&this->_name);
  sqvector<long_long>::~sqvector(&this->_typecheck);
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQRefCounted_0013d8a0;
  pSVar2 = (this->super_SQCollectable).super_SQRefCounted._weakref;
  if (pSVar2 != (SQWeakRef *)0x0) {
    (pSVar2->_obj)._type = OT_NULL;
    (pSVar2->_obj)._unVal.pTable = (SQTable *)0x0;
  }
  return;
}

Assistant:

~SQNativeClosure()
    {
        __ObjRelease(_env);
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
    }